

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_fan(envy_bios *bios)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  uVar4 = (bios->power).fan.offset;
  iVar9 = -0x16;
  if ((ulong)uVar4 != 0) {
    if (uVar4 < bios->length) {
      uVar3 = bios->data[uVar4];
      (bios->power).fan.version = uVar3;
    }
    else {
      (bios->power).fan.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar3 = (bios->power).fan.version;
    }
    if (uVar3 == '\x10') {
      uVar5 = (bios->power).fan.offset;
      uVar4 = bios->length;
      if (uVar5 + 1 < uVar4) {
        (bios->power).fan.hlen = bios->data[uVar5 + 1];
        iVar9 = 0;
      }
      else {
        (bios->power).fan.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar5 = (bios->power).fan.offset;
        uVar4 = bios->length;
        iVar9 = -0xe;
      }
      if (uVar5 + 2 < uVar4) {
        (bios->power).fan.rlen = bios->data[uVar5 + 2];
        iVar8 = 0;
      }
      else {
        (bios->power).fan.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar5 = (bios->power).fan.offset;
        uVar4 = bios->length;
        iVar8 = -0xe;
      }
      if (uVar5 + 3 < uVar4) {
        (bios->power).fan.entriesnum = bios->data[uVar5 + 3];
        iVar7 = 0;
      }
      else {
        (bios->power).fan.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar5 = (bios->power).fan.offset;
        uVar4 = bios->length;
        iVar7 = -0xe;
      }
      (bios->power).fan.valid = (iVar8 == 0 && iVar9 == 0) && iVar7 == 0;
      uVar10 = (bios->power).fan.hlen + uVar5;
      if (uVar10 < uVar4) {
        (bios->power).fan.type = bios->data[uVar10];
      }
      else {
        (bios->power).fan.type = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar10);
        uVar4 = bios->length;
      }
      if (uVar10 + 2 < uVar4) {
        (bios->power).fan.duty_min = bios->data[uVar10 + 2];
      }
      else {
        (bios->power).fan.duty_min = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar4 = bios->length;
      }
      if (uVar10 + 3 < uVar4) {
        (bios->power).fan.duty_max = bios->data[uVar10 + 3];
      }
      else {
        (bios->power).fan.duty_max = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        uVar4 = bios->length;
      }
      uVar1 = uVar10 + 0xe;
      if (uVar1 < uVar4) {
        puVar2 = bios->data;
        uVar6 = (uint)CONCAT12(puVar2[uVar10 + 0xd],
                               CONCAT11(puVar2[uVar10 + 0xc],puVar2[uVar10 + 0xb]));
      }
      else {
        (bios->power).fan.divisor = 0;
        fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
        uVar4 = bios->length;
        uVar6 = (bios->power).fan.divisor & 0xffffff;
      }
      (bios->power).fan.divisor = uVar6;
      if (uVar10 + 0xf < uVar4) {
        (bios->power).fan.unk0e = CONCAT11(bios->data[uVar10 + 0xf],bios->data[uVar1]);
      }
      else {
        (bios->power).fan.unk0e = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n",(ulong)uVar1);
        uVar4 = bios->length;
      }
      if (uVar10 + 0x11 < uVar4) {
        (bios->power).fan.unk10 = CONCAT11(bios->data[uVar10 + 0x11],bios->data[uVar10 + 0x10]);
      }
      else {
        (bios->power).fan.unk10 = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar4 = bios->length;
      }
      if (uVar10 + 0x15 < uVar4) {
        (bios->power).fan.unboost_unboost_ms =
             CONCAT11(bios->data[uVar10 + 0x15],bios->data[uVar10 + 0x14]);
      }
      else {
        (bios->power).fan.unboost_unboost_ms = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar4 = bios->length;
      }
      uVar10 = uVar10 + 0x17;
      if (uVar10 < uVar4) {
        (bios->power).fan.duty_boosted = bios->data[uVar10];
        iVar9 = 0;
      }
      else {
        (bios->power).fan.duty_boosted = '\0';
        iVar9 = 0;
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar10);
      }
    }
    else {
      envy_bios_parse_power_fan_cold_1();
    }
  }
  return iVar9;
}

Assistant:

int envy_bios_parse_power_fan(struct envy_bios *bios) {
	struct envy_bios_power_fan *fan = &bios->power.fan;
	uint32_t data;
	int err = 0;

	if (!fan->offset)
		return -EINVAL;

	bios_u8(bios, fan->offset + 0x0, &fan->version);
	switch(fan->version) {
	case 0x10:
		err |= bios_u8(bios, fan->offset + 0x1, &fan->hlen);
		err |= bios_u8(bios, fan->offset + 0x2, &fan->rlen);
		err |= bios_u8(bios, fan->offset + 0x3, &fan->entriesnum);

		fan->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN table version 0x%x\n", fan->version);
		return -EINVAL;
	};

	/* go to the first entry */
	data = fan->offset + fan->hlen;

	bios_u8(bios, data + 0x00, &fan->type);
	bios_u8(bios, data + 0x02, &fan->duty_min);
	bios_u8(bios, data + 0x03, &fan->duty_max);
	/* 0x10 == constant to 9? */
	bios_u32(bios, data + 0x0b, &fan->divisor); fan->divisor &= 0xffffff;
	bios_u16(bios, data + 0x0e, &fan->unk0e); /* looks like the fan bump delay */
	bios_u16(bios, data + 0x10, &fan->unk10); /* looks like the fan slow down delay */
	bios_u16(bios, data + 0x14, &fan->unboost_unboost_ms);
	bios_u8(bios, data + 0x17, &fan->duty_boosted); /* threshold = 96 °C */

	/* temp fan bump min = 45°C */
	/* temp fan max = 95°C */

	return 0;
}